

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  Hospital New_Hospital;
  Hospital local_90;
  
  Hospital::Hospital(&local_90);
  Hospital::menu(&local_90);
  std::vector<Patient,_std::allocator<Patient>_>::~vector(&local_90.All_Of_Patients);
  std::vector<Nurse,_std::allocator<Nurse>_>::~vector(&local_90.All_Of_Nurses);
  std::vector<Doctor,_std::allocator<Doctor>_>::~vector(&local_90.All_Of_Doctors);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.Admin_Password._M_dataplus._M_p != &local_90.Admin_Password.field_2) {
    operator_delete(local_90.Admin_Password._M_dataplus._M_p,
                    local_90.Admin_Password.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.Admin_Username._M_dataplus._M_p != &local_90.Admin_Username.field_2) {
    operator_delete(local_90.Admin_Username._M_dataplus._M_p,
                    local_90.Admin_Username.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main() {

    Hospital New_Hospital;
    New_Hospital.menu();

    return 0;
}